

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

const_iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
          (const_iterator *__return_storage_ptr__,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this)

{
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_28;
  
  InnerMap::
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  ::iterator_base(&local_28,this->elements_);
  (__return_storage_ptr__->it_).node_ = local_28.node_;
  (__return_storage_ptr__->it_).m_ = local_28.m_;
  (__return_storage_ptr__->it_).bucket_index_ = local_28.bucket_index_;
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin() const {
    return const_iterator(iterator(elements_->begin()));
  }